

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O3

bool __thiscall
glcts::TextureBorderClampSamplingTexture<int,_int>::checkLinear
          (TextureBorderClampSamplingTexture<int,_int> *this,
          vector<int,_std::allocator<int>_> *buffer,GLint layer)

{
  ostringstream *poVar1;
  uint uVar2;
  uint uVar3;
  pointer piVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  uVar14 = (this->m_test_configuration).m_width;
  uVar6 = uVar14 >> 1;
  uVar15 = (this->m_test_configuration).m_height;
  uVar11 = uVar15 >> 1;
  uVar2 = (this->m_test_configuration).m_n_in_components;
  uVar8 = (ulong)uVar2;
  uVar3 = (this->m_test_configuration).m_n_out_components;
  iVar13 = uVar3 * uVar14;
  if (2 < uVar15) {
    uVar7 = uVar8;
    if (uVar3 < uVar2) {
      uVar7 = (ulong)uVar3;
    }
    piVar4 = (buffer->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    uVar10 = (uVar14 * uVar11 + uVar6) * uVar3;
    uVar12 = ((uVar11 + 1) * uVar14 + uVar6) * uVar3;
    uVar5 = uVar7;
    uVar16 = uVar12;
    uVar17 = uVar11;
    uVar9 = uVar10;
    do {
      for (; uVar5 != 0; uVar5 = uVar5 - 1) {
        if (piVar4[uVar12] - piVar4[uVar10] < 0) {
          local_1b0._0_8_ =
               ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"For layer (",0xb);
          std::ostream::operator<<(poVar1,layer);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,") when moving from center point  (x, y)  = (",0x2c);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,") to the bottom\n",0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"at point (x, y)  = (",0x14);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,") - texel values stopped to be monotonically increasing\n",
                     0x38);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_00ccba50;
        }
        uVar10 = uVar10 + 1;
        uVar12 = uVar12 + 1;
      }
      uVar17 = uVar17 + 1;
      uVar10 = uVar9 + iVar13;
      uVar12 = uVar16 + iVar13;
      uVar5 = uVar7;
      uVar16 = uVar12;
      uVar9 = uVar10;
    } while (uVar17 < uVar11 + uVar15 / 3);
  }
  uVar15 = uVar11 - uVar15 / 3;
  if (uVar15 < uVar11) {
    uVar7 = uVar8;
    if (uVar3 < uVar2) {
      uVar7 = (ulong)uVar3;
    }
    piVar4 = (buffer->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    uVar10 = (uVar14 * uVar11 + uVar6) * uVar3;
    uVar12 = ((uVar11 - 1) * uVar14 + uVar6) * uVar3;
    uVar5 = uVar7;
    uVar16 = uVar11;
    uVar17 = uVar12;
    uVar9 = uVar10;
    do {
      for (; uVar5 != 0; uVar5 = uVar5 - 1) {
        if (piVar4[uVar12] - piVar4[uVar10] < 0) {
          local_1b0._0_8_ =
               ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"For layer (",0xb);
          std::ostream::operator<<(poVar1,layer);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,") when moving from center point  (x, y)  = (",0x2c);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") to the top\n",0xd)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"at point (x, y)  = (",0x14);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,")- texel values stopped to be monotonically increasing\n",
                     0x37);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_00ccba50;
        }
        uVar10 = uVar10 + 1;
        uVar12 = uVar12 + 1;
      }
      uVar16 = uVar16 - 1;
      uVar10 = uVar9 - iVar13;
      uVar12 = uVar17 - iVar13;
      uVar5 = uVar7;
      uVar17 = uVar12;
      uVar9 = uVar10;
    } while (uVar15 < uVar16);
  }
  if (2 < uVar14) {
    uVar7 = uVar8;
    if (uVar3 < uVar2) {
      uVar7 = (ulong)uVar3;
    }
    piVar4 = (buffer->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    uVar10 = uVar3 * uVar6 + uVar11;
    uVar12 = (uVar6 + 1) * uVar3 + uVar11;
    uVar5 = uVar7;
    uVar15 = uVar6;
    uVar16 = uVar10;
    uVar17 = uVar12;
    do {
      for (; uVar5 != 0; uVar5 = uVar5 - 1) {
        if (piVar4[uVar12] - piVar4[uVar10] < 0) {
          local_1b0._0_8_ =
               ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"For layer (",0xb);
          std::ostream::operator<<(poVar1,layer);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,") when moving from center point  (x, y) = (",0x2b);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,") to the right\n",0xf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"at point (x, y)  = (",0x14);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,")- texel values stopped to be monotonically increasing\n",
                     0x37);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_00ccba50;
        }
        uVar10 = uVar10 + 1;
        uVar12 = uVar12 + 1;
      }
      uVar15 = uVar15 + 1;
      uVar10 = uVar16 + uVar3;
      uVar12 = uVar17 + uVar3;
      uVar5 = uVar7;
      uVar16 = uVar10;
      uVar17 = uVar12;
    } while (uVar15 < uVar6 + uVar14 / 3);
  }
  uVar6 = uVar6 - uVar14 / 3;
  if (uVar6 < uVar11) {
    if (uVar3 < uVar2) {
      uVar8 = (ulong)uVar3;
    }
    piVar4 = (buffer->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    uVar14 = (uVar3 + 1) * uVar11;
    uVar7 = uVar8;
    uVar15 = uVar14;
    do {
      for (; uVar7 != 0; uVar7 = uVar7 - 1) {
        if (piVar4[uVar14 - uVar3] - piVar4[uVar14] < 0) {
          local_1b0._0_8_ =
               ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"For layer (",0xb);
          std::ostream::operator<<(poVar1,layer);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,") when moving from center point  (x, y) = (",0x2b);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,") to the left\n",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"at point (x, y)  = (",0x14);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,")- texel values stopped to be monotonically increasing\n",
                     0x37);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00ccba50:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
          std::ios_base::~ios_base(local_138);
          return false;
        }
        uVar14 = uVar14 + 1;
      }
      uVar11 = uVar11 - 1;
      uVar14 = uVar15 - uVar3;
      uVar7 = uVar8;
      uVar15 = uVar14;
    } while (uVar6 < uVar11);
  }
  return true;
}

Assistant:

bool TextureBorderClampSamplingTexture<InputType, OutputType>::checkLinear(std::vector<OutputType>& buffer,
																		   glw::GLint layer)
{
	glw::GLuint centerX = m_test_configuration.get_width() / 2;
	glw::GLuint centerY = m_test_configuration.get_height() / 2;
	glw::GLuint stepX   = m_test_configuration.get_width() / 3;
	glw::GLuint stepY   = m_test_configuration.get_height() / 3;

	glw::GLuint index = 0;

	glw::GLuint in_components  = m_test_configuration.get_n_in_components();
	glw::GLuint out_components = m_test_configuration.get_n_out_components();
	glw::GLuint outRowWidth	= m_test_configuration.get_width() * out_components;

	/* Check values from center to the bottom */
	for (glw::GLuint y = centerY; y < centerY + stepY; ++y)
	{
		for (glw::GLuint c = 0; c < deMinu32(out_components, in_components); ++c)
		{
			index = y * outRowWidth + centerX * out_components + c;
			if (buffer[index + outRowWidth] - buffer[index] < 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "For layer (" << layer
								   << ") when moving from center point  (x, y)  = (" << centerX << "," << centerY
								   << ") to the bottom\n"
								   << "at point (x, y)  = (" << centerX << "," << y
								   << ") - texel values stopped to be monotonically increasing\n"
								   << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}

	/* Check values from center to the top */
	for (glw::GLuint y = centerY; y > centerY - stepY; --y)
	{
		for (glw::GLuint c = 0; c < deMinu32(out_components, in_components); ++c)
		{
			index = y * outRowWidth + centerX * out_components + c;
			if (buffer[index - outRowWidth] - buffer[index] < 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "For layer (" << layer
								   << ") when moving from center point  (x, y)  = (" << centerX << "," << centerY
								   << ") to the top\n"
								   << "at point (x, y)  = (" << centerX << "," << y
								   << ")- texel values stopped to be monotonically increasing\n"
								   << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}

	/* Check values from center to the right */
	for (glw::GLuint x = centerX; x < centerX + stepX; ++x)
	{
		for (glw::GLuint c = 0; c < deMinu32(out_components, in_components); ++c)
		{
			index = centerY + x * out_components + c;
			if (buffer[index + out_components] - buffer[index] < 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "For layer (" << layer
								   << ") when moving from center point  (x, y) = (" << centerX << "," << centerY
								   << ") to the right\n"
								   << "at point (x, y)  = (" << x << "," << centerY
								   << ")- texel values stopped to be monotonically increasing\n"
								   << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}

	/* Check values from center to the left */
	for (glw::GLuint x = centerY; x > centerX - stepX; --x)
	{
		for (glw::GLuint c = 0; c < deMinu32(out_components, in_components); ++c)
		{
			index = centerY + x * out_components + c;
			if (buffer[index - out_components] - buffer[index] < 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "For layer (" << layer
								   << ") when moving from center point  (x, y) = (" << centerX << "," << centerY
								   << ") to the left\n"
								   << "at point (x, y)  = (" << x << "," << centerY
								   << ")- texel values stopped to be monotonically increasing\n"
								   << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}

	return true;
}